

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderStairs<ImPlot::GetterXsYs<signed_char>,ImPlot::TransformerLogLog>
               (GetterXsYs<signed_char> *getter,TransformerLogLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  char cVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  ImDrawList *this;
  long lVar9;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  ImDrawList *local_68;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar7 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_68 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_48 = iVar10 + -1;
    local_40 = line_weight * 0.5;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    cVar3 = getter->Ys[lVar9];
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar5 = log10((double)(int)getter->Xs[lVar9] / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar7->CurrentPlot;
    local_98._8_4_ = extraout_XMM0_Dc_01;
    local_98._0_8_ = dVar5;
    local_98._12_4_ = extraout_XMM0_Dd_01;
    local_88._8_8_ = 0;
    local_88._0_8_ = pIVar7->LogDenX;
    dVar5 = (pIVar4->XAxis).Range.Min;
    local_78 = (pIVar4->XAxis).Range.Max;
    uStack_70 = 0;
    dVar6 = log10((double)(int)cVar3 / pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar4 = pIVar7->CurrentPlot;
    auVar14._8_8_ = dVar6;
    auVar14._0_8_ = local_98._0_8_;
    auVar17._8_8_ = pIVar7->LogDenY[iVar10];
    auVar17._0_8_ = local_88._0_8_;
    auVar12 = divpd(auVar14,auVar17);
    dVar6 = pIVar4->YAxis[iVar10].Range.Min;
    IVar2 = pIVar7->PixelRange[iVar10].Min;
    local_3c.y = (float)(pIVar7->My[iVar10] *
                         (((double)(float)auVar12._8_8_ * (pIVar4->YAxis[iVar10].Range.Max - dVar6)
                          + dVar6) - dVar6) + (double)IVar2.y);
    local_3c.x = (float)(pIVar7->Mx *
                         (((double)(float)auVar12._0_8_ * (local_78 - dVar5) + dVar5) -
                         (pIVar4->XAxis).Range.Min) + (double)IVar2.x);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<signed_char>,ImPlot::TransformerLogLog>>
              ((StairsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLogLog> *)
               local_58,local_68,&pIVar4->PlotRect);
  }
  else {
    iVar10 = getter->Count;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    cVar3 = getter->Ys[lVar9];
    dVar5 = log10((double)(int)getter->Xs[lVar9] / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar7->CurrentPlot;
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_8_ = dVar5;
    local_88._12_4_ = extraout_XMM0_Dd;
    local_98._8_8_ = 0;
    local_98._0_8_ = pIVar7->LogDenX;
    dVar5 = (pIVar4->XAxis).Range.Min;
    local_78 = (pIVar4->XAxis).Range.Max;
    uStack_70 = 0;
    dVar6 = log10((double)(int)cVar3 / pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar4 = pIVar7->CurrentPlot;
    auVar15._8_8_ = pIVar7->LogDenY[iVar10];
    auVar15._0_8_ = local_98._0_8_;
    auVar12._8_8_ = dVar6;
    auVar12._0_8_ = local_88._0_8_;
    auVar12 = divpd(auVar12,auVar15);
    dVar6 = pIVar4->YAxis[iVar10].Range.Min;
    IVar2 = pIVar7->PixelRange[iVar10].Min;
    local_58._4_4_ =
         (float)(pIVar7->My[iVar10] *
                 (((double)(float)auVar12._8_8_ * (pIVar4->YAxis[iVar10].Range.Max - dVar6) + dVar6)
                 - dVar6) + (double)IVar2.y);
    local_58._0_4_ =
         (float)(pIVar7->Mx *
                 (((double)(float)auVar12._0_8_ * (local_78 - dVar5) + dVar5) -
                 (pIVar4->XAxis).Range.Min) + (double)IVar2.x);
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      do {
        pIVar8 = GImPlot;
        lVar9 = (long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                (long)getter->Stride;
        cVar3 = getter->Ys[lVar9];
        dVar5 = log10((double)(int)getter->Xs[lVar9] / (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar4 = pIVar8->CurrentPlot;
        local_98._8_4_ = extraout_XMM0_Dc_00;
        local_98._0_8_ = dVar5;
        local_98._12_4_ = extraout_XMM0_Dd_00;
        local_88._8_8_ = 0;
        local_88._0_8_ = pIVar8->LogDenX;
        dVar5 = (pIVar4->XAxis).Range.Min;
        local_78 = (pIVar4->XAxis).Range.Max;
        uStack_70 = 0;
        dVar6 = log10((double)(int)cVar3 / pIVar4->YAxis[transformer->YAxis].Range.Min);
        this = local_68;
        iVar10 = transformer->YAxis;
        pIVar4 = pIVar8->CurrentPlot;
        auVar13._8_8_ = dVar6;
        auVar13._0_8_ = local_98._0_8_;
        auVar16._8_8_ = pIVar8->LogDenY[iVar10];
        auVar16._0_8_ = local_88._0_8_;
        auVar12 = divpd(auVar13,auVar16);
        dVar6 = pIVar4->YAxis[iVar10].Range.Min;
        IVar2 = pIVar8->PixelRange[iVar10].Min;
        local_60.x = (float)(pIVar8->Mx *
                             (((double)(float)auVar12._0_8_ * (local_78 - dVar5) + dVar5) -
                             (pIVar4->XAxis).Range.Min) + (double)IVar2.x);
        local_60.y = (float)(pIVar8->My[iVar10] *
                             (((double)(float)auVar12._8_8_ *
                               (pIVar4->YAxis[iVar10].Range.Max - dVar6) + dVar6) - dVar6) +
                            (double)IVar2.y);
        pIVar4 = pIVar7->CurrentPlot;
        fVar18 = (float)local_58._4_4_;
        if (local_60.y <= (float)local_58._4_4_) {
          fVar18 = local_60.y;
        }
        if ((fVar18 < (pIVar4->PlotRect).Max.y) &&
           (fVar18 = (float)(~-(uint)(local_60.y <= (float)local_58._4_4_) & (uint)local_60.y |
                            -(uint)(local_60.y <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar18 && fVar18 != *pfVar1)) {
          fVar18 = (float)local_58._0_4_;
          if (local_60.x <= (float)local_58._0_4_) {
            fVar18 = local_60.x;
          }
          if ((fVar18 < (pIVar4->PlotRect).Max.x) &&
             (fVar18 = (float)(-(uint)(local_60.x <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(local_60.x <= (float)local_58._0_4_) & (uint)local_60.x),
             (pIVar4->PlotRect).Min.x <= fVar18 && fVar18 != (pIVar4->PlotRect).Min.x)) {
            local_a0.y = (float)local_58._4_4_;
            local_a0.x = local_60.x;
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_a0,col,line_weight);
            ImDrawList::AddLine(this,&local_a0,&local_60,col,line_weight);
          }
        }
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}